

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_navigate_up(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  _Bool _Var2;
  wchar_t wVar3;
  loc lVar4;
  square *psVar5;
  monster *mon;
  chunk_conflict *pcVar6;
  int y;
  int x;
  char *fmt;
  int iVar7;
  
  if (player->timed[4] == 0) {
    lVar4.x = (player->grid).x;
    lVar4.y = (player->grid).y;
    _Var2 = square_iswebbed(cave,lVar4);
    if (_Var2) {
      msg("You clear the web.");
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_destroy_trap(cave,grid);
      player->upkeep->energy_use = (uint)z_info->move_energy;
      return;
    }
    if (0 < cave->height) {
      iVar7 = 0;
      y = 0;
      pcVar6 = cave;
      do {
        if (0 < pcVar6->width) {
          x = 0;
          do {
            lVar4 = (loc)loc(x,y);
            _Var2 = loc_eq((loc_conflict)lVar4,player->grid);
            if ((!_Var2) && (_Var2 = square_isoccupied(cave,lVar4), _Var2)) {
              psVar5 = square(cave,lVar4);
              mon = cave_monster(cave,(int)psVar5->mon);
              _Var2 = monster_is_obvious(mon);
              if (_Var2) {
                iVar7 = iVar7 + 1;
                pcVar6 = cave;
                break;
              }
            }
            x = x + 1;
            pcVar6 = cave;
          } while (x < cave->width);
        }
        y = y + 1;
      } while (y < pcVar6->height);
      if (0 < iVar7) {
        fmt = "Something is here.";
        goto LAB_0012d202;
      }
    }
    ppVar1 = player->upkeep;
    if (ppVar1->steps != (int16_t *)0x0) {
      __assert_fail("!player->upkeep->steps",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                    ,0x5de,"void do_cmd_navigate_up(struct command *)");
    }
    wVar3 = path_nearest_known(player,player->grid,square_isupstairs,&ppVar1->path_dest,
                               &ppVar1->steps);
    ppVar1 = player->upkeep;
    ppVar1->step_count = wVar3;
    if (L'\0' < wVar3) {
      ppVar1->running = wVar3;
      *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
      run_step(L'\0');
      return;
    }
    fmt = "No known path to upstairs.";
  }
  else {
    fmt = "You cannot explore while confused.";
  }
LAB_0012d202:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_navigate_up(struct command *cmd)
{
	int visible_monster_count = 0;
	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);

			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster_count++;
					break;
				}
			}
		}
	}

	if (visible_monster_count > 0) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_known(player, player->grid,
		square_isupstairs, &player->upkeep->path_dest,
		&player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No known path to upstairs.");
}